

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::MapBuffer
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,IBuffer *pBuffer,MAP_TYPE MapType,
          MAP_FLAGS MapFlags,PVoid *pMappedData)

{
  bool bVar1;
  CPU_ACCESS_FLAGS CVar2;
  MAP_FLAGS MVar3;
  MAP_FLAGS MVar4;
  int iVar5;
  Char *pCVar6;
  undefined4 extraout_var;
  mapped_type *pmVar7;
  undefined1 local_258 [8];
  string msg_15;
  string msg_14;
  string msg_13;
  string msg_12;
  string msg_11;
  string msg_10;
  string msg_9;
  string msg_8;
  string msg_7;
  string msg_6;
  string msg_5;
  string msg_4;
  string msg_3;
  string msg_2;
  undefined1 local_90 [8];
  string msg_1;
  _Node_iterator_base<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_false>
  local_68;
  char (*local_60) [9];
  BufferDesc *BuffDesc;
  undefined1 local_48 [8];
  string msg;
  PVoid *pMappedData_local;
  MAP_FLAGS MapFlags_local;
  IBuffer *pIStack_18;
  MAP_TYPE MapType_local;
  IBuffer *pBuffer_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = pMappedData;
  pIStack_18 = pBuffer;
  pBuffer_local = (IBuffer *)this;
  if (pBuffer == (IBuffer *)0x0) {
    FormatString<char[25]>((string *)local_48,(char (*) [25])0xf4e9c6);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"MapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6e8);
    std::__cxx11::string::~string((string *)local_48);
  }
  iVar5 = (*(pIStack_18->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  local_60 = (char (*) [9])CONCAT44(extraout_var,iVar5);
  local_68._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::IBuffer_*,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo,_std::hash<Diligent::IBuffer_*>,_std::equal_to<Diligent::IBuffer_*>,_std::allocator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>_>_>
       ::find(&this->m_DbgMappedBuffers,&stack0xffffffffffffffe8);
  msg_1.field_2._8_8_ =
       std::
       unordered_map<Diligent::IBuffer_*,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo,_std::hash<Diligent::IBuffer_*>,_std::equal_to<Diligent::IBuffer_*>,_std::allocator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>_>_>
       ::end(&this->m_DbgMappedBuffers);
  bVar1 = std::__detail::operator==
                    (&local_68,
                     (_Node_iterator_base<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_false>
                      *)((long)&msg_1.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    FormatString<char[9],char_const*,char[26]>
              ((string *)local_90,(Diligent *)0xe50594,local_60,
               (char **)"\' has already been mapped",(char (*) [26])pMappedData);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"MapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6ee);
    std::__cxx11::string::~string((string *)local_90);
  }
  pmVar7 = std::
           unordered_map<Diligent::IBuffer_*,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo,_std::hash<Diligent::IBuffer_*>,_std::equal_to<Diligent::IBuffer_*>,_std::allocator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>_>_>
           ::operator[](&this->m_DbgMappedBuffers,&stack0xffffffffffffffe8);
  pmVar7->MapType = MapType;
  *(undefined8 *)msg.field_2._8_8_ = 0;
  if (MapType == MAP_READ) {
    if ((local_60[2][2] != '\x03') && (local_60[2][2] != '\x04')) {
      FormatString<char[81]>
                ((string *)((long)&msg_3.field_2 + 8),
                 (char (*) [81])
                 "Only buffers with usage USAGE_STAGING or USAGE_UNIFIED can be mapped for reading")
      ;
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x6f8);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
    CVar2 = Diligent::operator&(local_60[2][3],CPU_ACCESS_READ);
    if (CVar2 == CPU_ACCESS_NONE) {
      FormatString<char[74]>
                ((string *)((long)&msg_4.field_2 + 8),
                 (char (*) [74])
                 "Buffer being mapped for reading was not created with CPU_ACCESS_READ flag");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x6f9);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
    MVar3 = Diligent::operator&(MapFlags,MAP_FLAG_DISCARD);
    if (MVar3 != MAP_FLAG_NONE) {
      FormatString<char[62]>
                ((string *)((long)&msg_5.field_2 + 8),
                 (char (*) [62])"MAP_FLAG_DISCARD is not valid when mapping buffer for reading");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x6fa);
      std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
    }
  }
  else if (MapType == MAP_WRITE) {
    if (((local_60[2][2] != '\x02') && (local_60[2][2] != '\x03')) && (local_60[2][2] != '\x04')) {
      FormatString<char[96]>
                ((string *)((long)&msg_6.field_2 + 8),
                 (char (*) [96])
                 "Only buffers with usage USAGE_STAGING, USAGE_DYNAMIC or USAGE_UNIFIED can be mapped for writing"
                );
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x6ff);
      std::__cxx11::string::~string((string *)(msg_6.field_2._M_local_buf + 8));
    }
    CVar2 = Diligent::operator&(local_60[2][3],CPU_ACCESS_FLAG_LAST);
    if (CVar2 == CPU_ACCESS_NONE) {
      FormatString<char[75]>
                ((string *)((long)&msg_7.field_2 + 8),
                 (char (*) [75])
                 "Buffer being mapped for writing was not created with CPU_ACCESS_WRITE flag");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x700);
      std::__cxx11::string::~string((string *)(msg_7.field_2._M_local_buf + 8));
    }
  }
  else if (MapType == MAP_READ_WRITE) {
    if ((local_60[2][2] != '\x03') && (local_60[2][2] != '\x04')) {
      FormatString<char[93]>
                ((string *)((long)&msg_8.field_2 + 8),
                 (char (*) [93])
                 "Only buffers with usage USAGE_STAGING or USAGE_UNIFIED can be mapped for reading and writing"
                );
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x705);
      std::__cxx11::string::~string((string *)(msg_8.field_2._M_local_buf + 8));
    }
    CVar2 = Diligent::operator&(local_60[2][3],CPU_ACCESS_FLAG_LAST);
    if (CVar2 == CPU_ACCESS_NONE) {
      FormatString<char[85]>
                ((string *)((long)&msg_9.field_2 + 8),
                 (char (*) [85])
                 "Buffer being mapped for reading & writing was not created with CPU_ACCESS_WRITE flag"
                );
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x706);
      std::__cxx11::string::~string((string *)(msg_9.field_2._M_local_buf + 8));
    }
    CVar2 = Diligent::operator&(local_60[2][3],CPU_ACCESS_READ);
    if (CVar2 == CPU_ACCESS_NONE) {
      FormatString<char[84]>
                ((string *)((long)&msg_10.field_2 + 8),
                 (char (*) [84])
                 "Buffer being mapped for reading & writing was not created with CPU_ACCESS_READ flag"
                );
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x707);
      std::__cxx11::string::~string((string *)(msg_10.field_2._M_local_buf + 8));
    }
    MVar3 = Diligent::operator&(MapFlags,MAP_FLAG_DISCARD);
    if (MVar3 != MAP_FLAG_NONE) {
      FormatString<char[74]>
                ((string *)((long)&msg_11.field_2 + 8),
                 (char (*) [74])
                 "MAP_FLAG_DISCARD is not valid when mapping buffer for reading and writing");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x708);
      std::__cxx11::string::~string((string *)(msg_11.field_2._M_local_buf + 8));
    }
  }
  else {
    FormatString<char[17]>((string *)((long)&msg_12.field_2 + 8),(char (*) [17])"Unknown map type");
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"MapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x70b);
    std::__cxx11::string::~string((string *)(msg_12.field_2._M_local_buf + 8));
  }
  if (local_60[2][2] == '\x02') {
    MVar3 = Diligent::operator|(MAP_FLAG_DISCARD,MAP_FLAG_NO_OVERWRITE);
    MVar3 = Diligent::operator&(MapFlags,MVar3);
    if ((MVar3 == MAP_FLAG_NONE) || (MapType != MAP_WRITE)) {
      FormatString<char[99]>
                ((string *)((long)&msg_13.field_2 + 8),
                 (char (*) [99])
                 "Dynamic buffers can only be mapped for writing with MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flag"
                );
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x710);
      std::__cxx11::string::~string((string *)(msg_13.field_2._M_local_buf + 8));
    }
    MVar3 = Diligent::operator|(MAP_FLAG_DISCARD,MAP_FLAG_NO_OVERWRITE);
    MVar3 = Diligent::operator&(MapFlags,MVar3);
    MVar4 = Diligent::operator|(MAP_FLAG_DISCARD,MAP_FLAG_NO_OVERWRITE);
    if (MVar3 == MVar4) {
      FormatString<char[107]>
                ((string *)((long)&msg_14.field_2 + 8),
                 (char (*) [107])
                 "When mapping dynamic buffer, only one of MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flags must be specified"
                );
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x711);
      std::__cxx11::string::~string((string *)(msg_14.field_2._M_local_buf + 8));
    }
  }
  MVar3 = Diligent::operator&(MapFlags,MAP_FLAG_DISCARD);
  if (MVar3 != MAP_FLAG_NONE) {
    if ((local_60[2][2] != '\x02') && (local_60[2][2] != '\x03')) {
      FormatString<char[65]>
                ((string *)((long)&msg_15.field_2 + 8),
                 (char (*) [65])"Only dynamic and staging buffers can be mapped with discard flag");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x716);
      std::__cxx11::string::~string((string *)(msg_15.field_2._M_local_buf + 8));
    }
    if (MapType != MAP_WRITE) {
      FormatString<char[63]>
                ((string *)local_258,
                 (char (*) [63])"MAP_FLAG_DISCARD is only valid when mapping buffer for writing");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x717);
      std::__cxx11::string::~string((string *)local_258);
    }
  }
  (this->m_Stats).CommandCounters.MapBuffer = (this->m_Stats).CommandCounters.MapBuffer + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::MapBuffer(
    IBuffer*  pBuffer,
    MAP_TYPE  MapType,
    MAP_FLAGS MapFlags,
    PVoid&    pMappedData)
{
    DEV_CHECK_ERR(pBuffer, "pBuffer must not be null");

    const BufferDesc& BuffDesc = pBuffer->GetDesc();

#ifdef DILIGENT_DEBUG
    {
        VERIFY(m_DbgMappedBuffers.find(pBuffer) == m_DbgMappedBuffers.end(), "Buffer '", BuffDesc.Name, "' has already been mapped");
        m_DbgMappedBuffers[pBuffer] = DbgMappedBufferInfo{MapType};
    }
#endif

    pMappedData = nullptr;
    switch (MapType)
    {
        case MAP_READ:
            DEV_CHECK_ERR(BuffDesc.Usage == USAGE_STAGING || BuffDesc.Usage == USAGE_UNIFIED,
                          "Only buffers with usage USAGE_STAGING or USAGE_UNIFIED can be mapped for reading");
            DEV_CHECK_ERR((BuffDesc.CPUAccessFlags & CPU_ACCESS_READ), "Buffer being mapped for reading was not created with CPU_ACCESS_READ flag");
            DEV_CHECK_ERR((MapFlags & MAP_FLAG_DISCARD) == 0, "MAP_FLAG_DISCARD is not valid when mapping buffer for reading");
            break;

        case MAP_WRITE:
            DEV_CHECK_ERR(BuffDesc.Usage == USAGE_DYNAMIC || BuffDesc.Usage == USAGE_STAGING || BuffDesc.Usage == USAGE_UNIFIED,
                          "Only buffers with usage USAGE_STAGING, USAGE_DYNAMIC or USAGE_UNIFIED can be mapped for writing");
            DEV_CHECK_ERR((BuffDesc.CPUAccessFlags & CPU_ACCESS_WRITE), "Buffer being mapped for writing was not created with CPU_ACCESS_WRITE flag");
            break;

        case MAP_READ_WRITE:
            DEV_CHECK_ERR(BuffDesc.Usage == USAGE_STAGING || BuffDesc.Usage == USAGE_UNIFIED,
                          "Only buffers with usage USAGE_STAGING or USAGE_UNIFIED can be mapped for reading and writing");
            DEV_CHECK_ERR((BuffDesc.CPUAccessFlags & CPU_ACCESS_WRITE), "Buffer being mapped for reading & writing was not created with CPU_ACCESS_WRITE flag");
            DEV_CHECK_ERR((BuffDesc.CPUAccessFlags & CPU_ACCESS_READ), "Buffer being mapped for reading & writing was not created with CPU_ACCESS_READ flag");
            DEV_CHECK_ERR((MapFlags & MAP_FLAG_DISCARD) == 0, "MAP_FLAG_DISCARD is not valid when mapping buffer for reading and writing");
            break;

        default: UNEXPECTED("Unknown map type");
    }

    if (BuffDesc.Usage == USAGE_DYNAMIC)
    {
        DEV_CHECK_ERR((MapFlags & (MAP_FLAG_DISCARD | MAP_FLAG_NO_OVERWRITE)) != 0 && MapType == MAP_WRITE, "Dynamic buffers can only be mapped for writing with MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flag");
        DEV_CHECK_ERR((MapFlags & (MAP_FLAG_DISCARD | MAP_FLAG_NO_OVERWRITE)) != (MAP_FLAG_DISCARD | MAP_FLAG_NO_OVERWRITE), "When mapping dynamic buffer, only one of MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flags must be specified");
    }

    if ((MapFlags & MAP_FLAG_DISCARD) != 0)
    {
        DEV_CHECK_ERR(BuffDesc.Usage == USAGE_DYNAMIC || BuffDesc.Usage == USAGE_STAGING, "Only dynamic and staging buffers can be mapped with discard flag");
        DEV_CHECK_ERR(MapType == MAP_WRITE, "MAP_FLAG_DISCARD is only valid when mapping buffer for writing");
    }

    ++m_Stats.CommandCounters.MapBuffer;
}